

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O1

void __thiscall YamlGenerator::generate(YamlGenerator *this,ostream *output,ScName *stmName)

{
  ScModel *pSVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  ScRegion *region;
  _Base_ptr p_Var8;
  char *pcVar9;
  char *local_60;
  char *local_58;
  char local_50;
  undefined7 uStack_4f;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  pSVar1 = (this->super_AbstractGenerator).m_model;
  if (stmName->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (output,"Note: discarding a state-machine name\n",0x26);
  }
  p_Var5 = (pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_40) {
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (output,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
      if (p_Var5[2]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  parent: ",10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,*(char **)(p_Var5 + 2),(long)p_Var5[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      if (p_Var5[3]._M_color != _S_red) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  history:\n",0xb);
        std::__ostream_insert<char,std::char_traits<char>>(output,"    mode: ",10);
        pcVar9 = "";
        if ((ulong)p_Var5[3]._M_color < 4) {
          pcVar9 = (&PTR_anon_var_dwarf_b3524_00127ce8)[p_Var5[3]._M_color];
        }
        sVar4 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(output,"    initial: ",0xd);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,(char *)p_Var5[3]._M_parent,(long)p_Var5[3]._M_left);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      if (p_Var5[4]._M_parent != p_Var5[4]._M_left) {
        local_60 = &local_50;
        local_58 = (char *)0x0;
        local_50 = '\0';
        if (1 < (ulong)(((long)p_Var5[4]._M_left - (long)p_Var5[4]._M_parent >> 4) *
                       -0x3333333333333333)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"  regions:\n",0xb);
          std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,0x11d24f);
        }
        p_Var2 = p_Var5[4]._M_left;
        p_Var8 = p_Var5[4]._M_parent;
        for (; local_38 = p_Var5, p_Var8 != p_Var2; p_Var8 = (_Base_ptr)&p_Var8[2]._M_left) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,local_60,(long)local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  initial: ",0xb);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,*(char **)p_Var8,(long)p_Var8->_M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,local_60,(long)local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  substates:\n",0xd);
          for (p_Var5 = p_Var8[1]._M_right; p_Var5 != (_Rb_tree_node_base *)&p_Var8[1]._M_parent;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,local_60,(long)local_58);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    - ",6);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          }
          p_Var5 = local_38;
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
      }
      if (p_Var5[6]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  transitions:\n",0xf);
        for (p_Var7 = p_Var5[5]._M_right; p_Var7 != (_Rb_tree_node_base *)&p_Var5[5]._M_parent;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"    - target: ",0xe);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if (p_Var7[2]._M_color != _S_red) {
            std::__ostream_insert<char,std::char_traits<char>>(output,"      history: ",0xf);
            pcVar9 = "";
            if ((ulong)p_Var7[2]._M_color < 4) {
              pcVar9 = (&PTR_anon_var_dwarf_b3524_00127ce8)[p_Var7[2]._M_color];
            }
            sVar4 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,sVar4);
            std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(output,"      events:\n",0xe);
          for (p_Var6 = *(_Rb_tree_node_base **)(p_Var7 + 3);
              p_Var6 != (_Rb_tree_node_base *)&p_Var7[2]._M_left;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            std::__ostream_insert<char,std::char_traits<char>>(output,"        - ",10);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          }
        }
      }
      if (p_Var5[7]._M_right != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  deferrals:\n",0xd);
        for (p_Var7 = p_Var5[7]._M_parent; p_Var7 != (_Rb_tree_node_base *)&p_Var5[6]._M_right;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"    - ",6);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_40);
  }
  std::ostream::flush();
  return;
}

Assistant:

void YamlGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << name << ":\n";
        if (state.isDefined()) {
            output << "  parent: " << state.parent << "\n";
        }

        print(output, state.historyState);
        print(output, state.regions);
        print(output, state.transitions);
        print(output, state.deferrals);

        output << "\n";
    }

    output.flush();
}